

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  string *source;
  pointer pCVar1;
  cmake *this_00;
  bool bVar2;
  cmListFileContext lfc;
  string local_68;
  cmOutputConverter converter;
  
  pCVar1 = (this->CallStack).
           super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->CallStack).
      super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start == pCVar1) {
    lfc.Name._M_dataplus._M_p = (pointer)&lfc.Name.field_2;
    lfc.Name._M_string_length = 0;
    lfc.Name.field_2._M_local_buf[0] = '\0';
    lfc.FilePath._M_dataplus._M_p = (pointer)&lfc.FilePath.field_2;
    lfc.FilePath._M_string_length = 0;
    lfc.FilePath.field_2._M_local_buf[0] = '\0';
    lfc.Line = 0;
    source = &lfc.FilePath;
    std::__cxx11::string::_M_assign((string *)source);
    bVar2 = cmake::GetIsInTryCompile(this->LocalGenerator->GlobalGenerator->CMakeInstance);
    if (!bVar2) {
      cmOutputConverter::cmOutputConverter(&converter,this->StateSnapshot);
      cmOutputConverter::Convert(&local_68,&converter,source,HOME,UNCHANGED);
      std::__cxx11::string::operator=((string *)source,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
    }
    lfc.Line = 0;
    cmake::IssueMessage(this->LocalGenerator->GlobalGenerator->CMakeInstance,t,text,&lfc);
    cmListFileContext::~cmListFileContext(&lfc);
  }
  else {
    if (t - FATAL_ERROR < 2) {
      (pCVar1[-1].Status)->NestedError = true;
    }
    this_00 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
    GetBacktrace((cmListFileBacktrace *)&lfc,this);
    cmake::IssueMessage(this_00,t,text,(cmListFileBacktrace *)&lfc);
    std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
              ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)&lfc);
  }
  return;
}

Assistant:

void cmMakefile::IssueMessage(cmake::MessageType t,
                              std::string const& text) const
{
  // Collect context information.
  if(!this->CallStack.empty())
    {
    if((t == cmake::FATAL_ERROR) || (t == cmake::INTERNAL_ERROR))
      {
      this->CallStack.back().Status->SetNestedError(true);
      }
    this->GetCMakeInstance()->IssueMessage(t, text, this->GetBacktrace());
    }
  else
    {
    cmListFileContext lfc;
    // We are not currently executing a command.  Add whatever context
    // information we have.
    lfc.FilePath = this->ListFileStack.back();

    if(!this->GetCMakeInstance()->GetIsInTryCompile())
      {
      cmOutputConverter converter(this->StateSnapshot);
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      }
    lfc.Line = 0;
    this->GetCMakeInstance()->IssueMessage(t, text, lfc);
    }
}